

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

_Bool ggml_backend_sched_buffer_supported(ggml_backend_sched_t sched,ggml_tensor *t,int backend_id)

{
  long lVar1;
  size_t sVar2;
  long in_RSI;
  long in_RDI;
  int tensor_backend_id;
  ggml_backend_buffer_type_t buft;
  ggml_backend_buffer_t buf;
  ggml_backend_buffer_type_t in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  _Bool _Var3;
  ggml_hash_set *in_stack_ffffffffffffffb8;
  ggml_hash_set *hash_set;
  long local_38;
  int local_2c;
  long local_28;
  
  if (*(long *)(in_RSI + 0xe8) == 0) {
    local_38 = *(long *)(in_RSI + 8);
  }
  else {
    local_38 = *(long *)(*(long *)(in_RSI + 0xe8) + 8);
  }
  local_28 = 0;
  if (local_38 == 0) {
    lVar1 = *(long *)(in_RDI + 0x128);
    sVar2 = ggml_hash_find_or_insert
                      (in_stack_ffffffffffffffb8,
                       (ggml_tensor *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
    ;
    local_2c = *(int *)(lVar1 + sVar2 * 4);
    if ((local_2c == -1) && (*(long *)(in_RSI + 0xe8) != 0)) {
      hash_set = *(ggml_hash_set **)(in_RDI + 0x128);
      sVar2 = ggml_hash_find_or_insert
                        (hash_set,(ggml_tensor *)
                                  CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      local_2c = *(int *)((long)&hash_set->size + sVar2 * 4);
    }
    if (local_2c != -1) {
      local_28 = *(long *)(in_RDI + 0x88 + (long)local_2c * 8);
    }
  }
  else {
    local_28 = *(long *)(local_38 + 0x48);
  }
  _Var3 = false;
  if (local_28 != 0) {
    _Var3 = ggml_backend_supports_buft
                      ((ggml_backend_t)(ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return _Var3;
}

Assistant:

static bool ggml_backend_sched_buffer_supported(ggml_backend_sched_t sched, struct ggml_tensor * t, int backend_id) {
    ggml_backend_buffer_t buf = t->view_src ? t->view_src->buffer : t->buffer;
    ggml_backend_buffer_type_t buft = NULL;

    if (buf) {
        // the tensor is already allocated
        buft = buf->buft;
    } else {
        // see if the tensor already has a backend assigned, and use the buffer type of that backend
        int tensor_backend_id = tensor_backend_id(t);
        if (tensor_backend_id == -1 && t->view_src) {
            tensor_backend_id = tensor_backend_id(t->view_src);
        }
        if (tensor_backend_id != -1) {
            buft = sched->bufts[tensor_backend_id];
        }
    }

    return buft != NULL && ggml_backend_supports_buft(sched->backends[backend_id], buft);
}